

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O2

int Disconnectublox(UBLOX *publox)

{
  int iVar1;
  size_t sVar2;
  
  if (publox->bSendStopSentence != 0) {
    sVar2 = strlen(publox->szStopSentence);
    iVar1 = TransferToublox(publox,(uchar *)publox->szStopSentence,(int)sVar2);
    if (iVar1 != 0) {
      puts("Error while disconnecting a ublox.");
      CloseRS232Port(&publox->RS232Port);
      return 1;
    }
    mSleep(0x32);
  }
  iVar1 = CloseRS232Port(&publox->RS232Port);
  if (iVar1 != 0) {
    puts("ublox disconnection failed.");
    return 1;
  }
  puts("ublox disconnected.");
  return 0;
}

Assistant:

inline int Disconnectublox(UBLOX* publox)
{
	if (publox->bSendStopSentence)
	{
		if (TransferToublox(publox, (unsigned char*)publox->szStopSentence, (int)strlen(publox->szStopSentence)) != EXIT_SUCCESS)
		{
			printf("Error while disconnecting a ublox.\n");
			CloseRS232Port(&publox->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(50);
	}
	if (CloseRS232Port(&publox->RS232Port) != EXIT_SUCCESS)
	{
		printf("ublox disconnection failed.\n");
		return EXIT_FAILURE;
	}

	printf("ublox disconnected.\n");

	return EXIT_SUCCESS;
}